

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::Texture2DFormatCase::iterate(Texture2DFormatCase *this)

{
  int preferredHeight;
  code *pcVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RGBA threshold_00;
  TestLog *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar7;
  undefined4 extraout_var_01;
  PixelFormat *pPVar8;
  Texture2D *pTVar9;
  TextureFormat *pTVar10;
  MessageBuilder *pMVar11;
  reference pvVar12;
  undefined4 extraout_var_02;
  Texture2DView TVar13;
  undefined1 local_3d8 [7];
  bool isOk;
  ConstPixelBufferAccess *local_3d0;
  SurfaceAccess local_3c8;
  PixelBufferAccess local_3a8;
  TextureParameterValueStr local_380;
  TextureParameterValueStr local_378;
  TextureParameterValueStr local_370;
  TextureParameterValueStr local_368;
  MessageBuilder local_360;
  Vector<float,_2> local_1dc;
  Vector<float,_2> local_1d4;
  Vector<float,_4> local_1cc;
  Sampler local_1bc;
  TextureFormat local_180;
  undefined4 local_174;
  undefined4 local_170;
  deUint32 magFilter;
  deUint32 minFilter;
  deUint32 wrapT;
  deUint32 wrapS;
  TextureFormatInfo spec;
  ReferenceParams renderParams;
  vector<float,_std::allocator<float>_> texCoord;
  RGBA threshold;
  undefined1 local_60 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  Functions *gl;
  TestLog *log;
  Texture2DFormatCase *this_local;
  long lVar6;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = this->m_width;
  preferredHeight = this->m_height;
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar7);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3,preferredHeight,dVar5);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_60,viewport.x,viewport.y);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = tcu::PixelFormat::getColorThreshold(pPVar8);
  tcu::RGBA::RGBA((RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,1,1,1,1);
  threshold_00 = tcu::operator+((RGBA *)((long)&texCoord.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),
                                (RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)(spec.lookupBias.m_data + 2),TEXTURETYPE_2D);
  pTVar9 = glu::Texture2D::getRefTexture(this->m_texture);
  pTVar10 = tcu::TextureLevelPyramid::getFormat(&pTVar9->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&wrapT,pTVar10);
  minFilter = 0x812f;
  magFilter = 0x812f;
  local_170 = 0x2600;
  local_174 = 0x2600;
  renderParams.super_RenderParams.texType._0_1_ =
       (undefined1)renderParams.super_RenderParams.texType |
       (TEXTURETYPE_LAST|TEXTURETYPE_CUBE_ARRAY);
  pTVar9 = glu::Texture2D::getRefTexture(this->m_texture);
  pTVar10 = tcu::TextureLevelPyramid::getFormat(&pTVar9->super_TextureLevelPyramid);
  local_180 = *pTVar10;
  spec.lookupBias.m_data[3] = (float)glu::TextureTestUtil::getSamplerType(local_180);
  tcu::Vector<float,_4>::Vector(&local_1cc,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_1bc,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,&local_1cc,false,MODE_DEPTH);
  tcu::Sampler::operator=
            ((Sampler *)(renderParams.super_RenderParams.colorBias.m_data + 2),&local_1bc);
  renderParams.super_RenderParams.bias = spec.valueMax.m_data[2];
  renderParams.super_RenderParams.ref = spec.valueMax.m_data[3];
  renderParams.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  renderParams.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  renderParams.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  renderParams.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  renderParams.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  renderParams.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_1d4,0.0,0.0);
  tcu::Vector<float,_2>::Vector(&local_1dc,1.0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,&local_1d4,&local_1dc)
  ;
  tcu::TestLog::operator<<(&local_360,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [20])"Texture parameters:");
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])"\n  WRAP_S = ");
  local_368 = glu::getTextureParameterValueStr(0x2802,0x812f);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_368);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])"\n  WRAP_T = ");
  local_370 = glu::getTextureParameterValueStr(0x2803,0x812f);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_370);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [17])"\n  MIN_FILTER = ");
  local_378 = glu::getTextureParameterValueStr(0x2801,0x2600);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_378);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [17])"\n  MAG_FILTER = ");
  local_380 = glu::getTextureParameterValueStr(0x2800,0x2600);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_380);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_360);
  (**(code **)(lVar6 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,viewport.x,
             viewport.y);
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar6 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar5 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar5);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0xb9);
  pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar12,(RenderParams *)(spec.lookupBias.m_data + 2));
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_3a8,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  &local_3a8);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0xbe);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess(&local_3c8,(Surface *)local_60,pPVar8);
  pTVar9 = glu::Texture2D::getRefTexture(this->m_texture);
  TVar13 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar9);
  local_3d0 = TVar13.m_levels;
  local_3d8._0_4_ = TVar13.m_numLevels;
  pvVar12 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  glu::TextureTestUtil::sampleTexture
            (&local_3c8,(Texture2DView *)local_3d8,pvVar12,
             (ReferenceParams *)(spec.lookupBias.m_data + 2));
  bVar2 = glu::TextureTestUtil::compareImages
                    (this_00,(Surface *)local_60,(Surface *)&referenceFrame.m_pixels.m_cap,
                     threshold_00);
  pcVar7 = "Image comparison failed";
  if (bVar2) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(byte)~bVar2 & QP_TEST_RESULT_FAIL,
             pcVar7);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

Texture2DFormatCase::IterateResult Texture2DFormatCase::iterate (void)
{
	TestLog&				log					= m_testCtx.getLog();
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_width, m_height, deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_2D);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());
	const deUint32			wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32			wrapT				= GL_CLAMP_TO_EDGE;
	const deUint32			minFilter			= GL_NEAREST;
	const deUint32			magFilter			= GL_NEAREST;

	renderParams.flags			|= RenderParams::LOG_ALL;
	renderParams.samplerType	= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	log << TestLog::Message << "Texture parameters:"
							<< "\n  WRAP_S = " << getTextureParameterValueStr(GL_TEXTURE_WRAP_S, wrapS)
							<< "\n  WRAP_T = " << getTextureParameterValueStr(GL_TEXTURE_WRAP_T, wrapT)
							<< "\n  MIN_FILTER = " << getTextureParameterValueStr(GL_TEXTURE_MIN_FILTER, minFilter)
							<< "\n  MAG_FILTER = " << getTextureParameterValueStr(GL_TEXTURE_MAG_FILTER, magFilter)
		<< TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}